

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp.c
# Opt level: O0

void nhdp_set_originator(netaddr *addr)

{
  oonf_log_source oVar1;
  undefined8 uVar2;
  undefined1 local_7e [8];
  netaddr_str buf;
  netaddr *addr_local;
  
  oVar1 = LOG_NHDP;
  buf.buf._54_8_ = addr;
  if (((&log_global_mask)[LOG_NHDP] & 1) != 0) {
    uVar2 = netaddr_to_prefixstring(local_7e,addr,0);
    oonf_log(1,oVar1,"src/nhdp/nhdp/nhdp.c",0xfc,0,0,"Set originator to %s",uVar2);
  }
  if (*(char *)(buf.buf._54_8_ + 0x10) == '\x02') {
    _originator_v4._addr._0_8_ = *(undefined8 *)buf.buf._54_8_;
    _originator_v4._addr._8_8_ = *(undefined8 *)(buf.buf._54_8_ + 8);
    _originator_v4._16_2_ = *(undefined2 *)(buf.buf._54_8_ + 0x10);
  }
  else if (*(char *)(buf.buf._54_8_ + 0x10) == '\n') {
    _originator_v6._addr._0_8_ = *(undefined8 *)buf.buf._54_8_;
    _originator_v6._addr._8_8_ = *(undefined8 *)(buf.buf._54_8_ + 8);
    _originator_v6._16_2_ = *(undefined2 *)(buf.buf._54_8_ + 0x10);
  }
  return;
}

Assistant:

void
nhdp_set_originator(const struct netaddr *addr) {
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str buf;
#endif

  OONF_DEBUG(LOG_NHDP, "Set originator to %s", netaddr_to_string(&buf, addr));
  if (netaddr_get_address_family(addr) == AF_INET) {
    memcpy(&_originator_v4, addr, sizeof(*addr));
  }
  else if (netaddr_get_address_family(addr) == AF_INET6) {
    memcpy(&_originator_v6, addr, sizeof(*addr));
  }
}